

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_7::TOutSliceInfo::TOutSliceInfo
          (TOutSliceInfo *this,PixelType t,size_t spst,size_t xStride,size_t yStride,bool z,int xtc,
          int ytc)

{
  bool z_local;
  size_t yStride_local;
  size_t xStride_local;
  size_t spst_local;
  PixelType t_local;
  TOutSliceInfo *this_local;
  
  this->type = t;
  this->sampleStride = spst;
  this->xStride = xStride;
  this->yStride = yStride;
  this->zero = z;
  this->xTileCoords = xtc;
  this->yTileCoords = ytc;
  return;
}

Assistant:

TOutSliceInfo::TOutSliceInfo (PixelType t,
                              size_t spst,
                              size_t xStride,
                              size_t yStride,
                              bool z,
                              int xtc,
                              int ytc)
:
    type (t),
    sampleStride (spst),
    xStride(xStride),
    yStride(yStride),
    zero (z),
    xTileCoords (xtc),
    yTileCoords (ytc)
{
    // empty
}